

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::MergeFrom
          (ItemSimilarityRecommender *this,ItemSimilarityRecommender *from)

{
  bool bVar1;
  LogMessage *other;
  ulong uVar2;
  ItemSimilarityRecommender *pIVar3;
  Arena *pAVar4;
  string *psVar5;
  StringVector *this_00;
  StringVector *from_00;
  Int64Vector *this_01;
  Int64Vector *from_01;
  LogFinisher local_c5;
  uint32_t cached_has_bits;
  byte local_b1;
  LogMessage local_b0;
  ItemSimilarityRecommender *local_78;
  ItemSimilarityRecommender *from_local;
  ItemSimilarityRecommender *this_local;
  ItemSimilarityRecommender *local_60;
  string *local_58;
  ItemSimilarityRecommender *local_50;
  string *local_48;
  ItemSimilarityRecommender *local_40;
  string *local_38;
  ItemSimilarityRecommender *local_30;
  string *local_28;
  ItemSimilarityRecommender *local_20;
  string *local_18;
  ItemSimilarityRecommender *local_10;
  
  local_b1 = 0;
  local_78 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/ItemSimilarityRecommender.pb.cc"
               ,0x40b);
    local_b1 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_b0,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_c5,other);
  }
  if ((local_b1 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_b0);
  }
  google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>
  ::MergeFrom(&this->itemitemsimilarities_,&local_78->itemitemsimilarities_);
  _internal_iteminputfeaturename_abi_cxx11_(local_78);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pIVar3 = (ItemSimilarityRecommender *)_internal_iteminputfeaturename_abi_cxx11_(local_78);
    this_local = pIVar3;
    local_60 = this;
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->iteminputfeaturename_,pIVar3,pAVar4);
  }
  _internal_numrecommendationsinputfeaturename_abi_cxx11_(local_78);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    psVar5 = _internal_numrecommendationsinputfeaturename_abi_cxx11_(local_78);
    local_58 = psVar5;
    local_50 = this;
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->numrecommendationsinputfeaturename_,psVar5,pAVar4);
  }
  _internal_itemrestrictioninputfeaturename_abi_cxx11_(local_78);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    psVar5 = _internal_itemrestrictioninputfeaturename_abi_cxx11_(local_78);
    local_48 = psVar5;
    local_40 = this;
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->itemrestrictioninputfeaturename_,psVar5,pAVar4);
  }
  _internal_itemexclusioninputfeaturename_abi_cxx11_(local_78);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    psVar5 = _internal_itemexclusioninputfeaturename_abi_cxx11_(local_78);
    local_38 = psVar5;
    local_30 = this;
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->itemexclusioninputfeaturename_,psVar5,pAVar4);
  }
  _internal_recommendeditemlistoutputfeaturename_abi_cxx11_(local_78);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    psVar5 = _internal_recommendeditemlistoutputfeaturename_abi_cxx11_(local_78);
    local_28 = psVar5;
    local_20 = this;
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->recommendeditemlistoutputfeaturename_,psVar5,pAVar4);
  }
  _internal_recommendeditemscoreoutputfeaturename_abi_cxx11_(local_78);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    psVar5 = _internal_recommendeditemscoreoutputfeaturename_abi_cxx11_(local_78);
    local_18 = psVar5;
    local_10 = this;
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->recommendeditemscoreoutputfeaturename_,psVar5,pAVar4);
  }
  bVar1 = _internal_has_itemstringids(local_78);
  if (bVar1) {
    this_00 = _internal_mutable_itemstringids(this);
    from_00 = _internal_itemstringids(local_78);
    StringVector::MergeFrom(this_00,from_00);
  }
  bVar1 = _internal_has_itemint64ids(local_78);
  if (bVar1) {
    this_01 = _internal_mutable_itemint64ids(this);
    from_01 = _internal_itemint64ids(local_78);
    Int64Vector::MergeFrom(this_01,from_01);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_78->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void ItemSimilarityRecommender::MergeFrom(const ItemSimilarityRecommender& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ItemSimilarityRecommender)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  itemitemsimilarities_.MergeFrom(from.itemitemsimilarities_);
  if (!from._internal_iteminputfeaturename().empty()) {
    _internal_set_iteminputfeaturename(from._internal_iteminputfeaturename());
  }
  if (!from._internal_numrecommendationsinputfeaturename().empty()) {
    _internal_set_numrecommendationsinputfeaturename(from._internal_numrecommendationsinputfeaturename());
  }
  if (!from._internal_itemrestrictioninputfeaturename().empty()) {
    _internal_set_itemrestrictioninputfeaturename(from._internal_itemrestrictioninputfeaturename());
  }
  if (!from._internal_itemexclusioninputfeaturename().empty()) {
    _internal_set_itemexclusioninputfeaturename(from._internal_itemexclusioninputfeaturename());
  }
  if (!from._internal_recommendeditemlistoutputfeaturename().empty()) {
    _internal_set_recommendeditemlistoutputfeaturename(from._internal_recommendeditemlistoutputfeaturename());
  }
  if (!from._internal_recommendeditemscoreoutputfeaturename().empty()) {
    _internal_set_recommendeditemscoreoutputfeaturename(from._internal_recommendeditemscoreoutputfeaturename());
  }
  if (from._internal_has_itemstringids()) {
    _internal_mutable_itemstringids()->::CoreML::Specification::StringVector::MergeFrom(from._internal_itemstringids());
  }
  if (from._internal_has_itemint64ids()) {
    _internal_mutable_itemint64ids()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_itemint64ids());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}